

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O3

void __thiscall
ByteData256_BytesConstructorException_Test::~ByteData256_BytesConstructorException_Test
          (ByteData256_BytesConstructorException_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData256, BytesConstructorException) {
  try {
    std::vector<uint8_t> target(25);
    ByteData256 byte_data = ByteData256(target);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "ByteData256 size unmatch.");
    return;
  }
  ASSERT_TRUE(false);
}